

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstddebug.cpp
# Opt level: O0

SQRESULT sqstd_register_debuglib(HSQUIRRELVM v)

{
  SQChar *in_RDI;
  SQInteger unaff_retaddr;
  SQInteger i;
  SQChar *in_stack_00000018;
  HSQUIRRELVM in_stack_00000020;
  HSQUIRRELVM in_stack_00000028;
  HSQUIRRELVM in_stack_00000030;
  SQChar *in_stack_00000048;
  SQInteger in_stack_00000050;
  HSQUIRRELVM in_stack_00000058;
  long local_10;
  
  for (local_10 = 0; debuglib_funcs[local_10].name != (SQChar *)0x0; local_10 = local_10 + 1) {
    sq_pushstring(in_stack_00000020,in_stack_00000018,(SQInteger)v);
    sq_newclosure(in_stack_00000030,(SQFUNCTION)in_stack_00000028,
                  (SQUnsignedInteger)in_stack_00000020);
    sq_setparamscheck(in_stack_00000058,in_stack_00000050,in_stack_00000048);
    sq_setnativeclosurename((HSQUIRRELVM)i,unaff_retaddr,in_RDI);
    sq_newslot(in_stack_00000028,(SQInteger)in_stack_00000020,(SQBool)in_stack_00000018);
  }
  return 0;
}

Assistant:

SQRESULT sqstd_register_debuglib(HSQUIRRELVM v)
{
  SQInteger i = 0;
  while (debuglib_funcs[i].name != 0)
  {
    sq_pushstring(v, debuglib_funcs[i].name, -1);
    sq_newclosure(v, debuglib_funcs[i].f, 0);
    sq_setparamscheck(v, debuglib_funcs[i].nparamscheck, debuglib_funcs[i].typemask);
    sq_setnativeclosurename(v, -1, debuglib_funcs[i].name);
    sq_newslot(v, -3, SQFalse);
    i++;
  }
  return SQ_OK;
}